

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

int __thiscall
btQuantizedBvh::sortAndCalcSplittingIndex
          (btQuantizedBvh *this,int startIndex,int endIndex,int splitAxis)

{
  btScalar *pbVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  btQuantizedBvh *in_RDI;
  float splitIndex_00;
  btVector3 bVar2;
  bool unbal;
  bool unbalanced;
  int rangeBalancedIndices;
  btVector3 center_1;
  btVector3 center;
  btVector3 means;
  btScalar splitValue;
  int numIndices;
  int splitIndex;
  int i;
  undefined4 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  btVector3 local_98;
  btVector3 in_stack_ffffffffffffff7c;
  btVector3 local_50;
  btScalar local_40;
  btScalar local_3c;
  btScalar local_38;
  btVector3 local_34;
  btScalar local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_20 = in_EDX - in_ESI;
  local_38 = 0.0;
  local_3c = 0.0;
  local_40 = 0.0;
  local_1c = in_ESI;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  btVector3::btVector3(&local_34,&local_38,&local_3c,&local_40);
  for (local_18 = local_c; local_18 < local_10; local_18 = local_18 + 1) {
    getAabbMax(in_RDI,CONCAT13(in_stack_ffffffffffffff1f,
                               CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)));
    in_stack_ffffffffffffff7c =
         getAabbMin(in_RDI,CONCAT13(in_stack_ffffffffffffff1f,
                                    CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)));
    operator+((btVector3 *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
              (btVector3 *)
              CONCAT17(in_stack_ffffffffffffff2f,
                       CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
    local_50 = ::operator*((btScalar *)in_RDI,
                           (btVector3 *)
                           CONCAT17(in_stack_ffffffffffffff1f,
                                    CONCAT16(in_stack_ffffffffffffff1e,
                                             CONCAT24(in_stack_ffffffffffffff1c,
                                                      in_stack_ffffffffffffff18))));
    btVector3::operator+=(&local_34,&local_50);
  }
  splitIndex_00 = 1.0 / (float)local_20;
  btVector3::operator*=(&local_34,(btScalar *)&stack0xffffffffffffff78);
  pbVar1 = btVector3::operator_cast_to_float_(&local_34);
  local_24 = pbVar1[local_14];
  for (local_18 = local_c; local_18 < local_10; local_18 = local_18 + 1) {
    getAabbMax(in_RDI,CONCAT13(in_stack_ffffffffffffff1f,
                               CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)));
    bVar2 = getAabbMin(in_RDI,CONCAT13(in_stack_ffffffffffffff1f,
                                       CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)
                                      ));
    operator+((btVector3 *)CONCAT44(bVar2.m_floats[0],in_stack_ffffffffffffff30),
              (btVector3 *)
              CONCAT17(in_stack_ffffffffffffff2f,
                       CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
    local_98 = ::operator*((btScalar *)in_RDI,
                           (btVector3 *)
                           CONCAT17(in_stack_ffffffffffffff1f,
                                    CONCAT16(in_stack_ffffffffffffff1e,
                                             CONCAT24(in_stack_ffffffffffffff1c,
                                                      in_stack_ffffffffffffff18))));
    pbVar1 = btVector3::operator_cast_to_float_(&local_98);
    if (local_24 < pbVar1[local_14]) {
      swapLeafNodes(in_stack_ffffffffffffff7c.m_floats._4_8_,
                    (int)in_stack_ffffffffffffff7c.m_floats[0],(int)splitIndex_00);
      local_1c = local_1c + 1;
    }
  }
  if (local_1c <= local_c + local_20 / 3 || (local_10 + -1) - local_20 / 3 <= local_1c) {
    local_1c = local_c + (local_20 >> 1);
  }
  return local_1c;
}

Assistant:

int	btQuantizedBvh::sortAndCalcSplittingIndex(int startIndex,int endIndex,int splitAxis)
{
	int i;
	int splitIndex =startIndex;
	int numIndices = endIndex - startIndex;
	btScalar splitValue;

	btVector3 means(btScalar(0.),btScalar(0.),btScalar(0.));
	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(getAabbMax(i)+getAabbMin(i));
		means+=center;
	}
	means *= (btScalar(1.)/(btScalar)numIndices);
	
	splitValue = means[splitAxis];
	
	//sort leafNodes so all values larger then splitValue comes first, and smaller values start from 'splitIndex'.
	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(getAabbMax(i)+getAabbMin(i));
		if (center[splitAxis] > splitValue)
		{
			//swap
			swapLeafNodes(i,splitIndex);
			splitIndex++;
		}
	}

	//if the splitIndex causes unbalanced trees, fix this by using the center in between startIndex and endIndex
	//otherwise the tree-building might fail due to stack-overflows in certain cases.
	//unbalanced1 is unsafe: it can cause stack overflows
	//bool unbalanced1 = ((splitIndex==startIndex) || (splitIndex == (endIndex-1)));

	//unbalanced2 should work too: always use center (perfect balanced trees)	
	//bool unbalanced2 = true;

	//this should be safe too:
	int rangeBalancedIndices = numIndices/3;
	bool unbalanced = ((splitIndex<=(startIndex+rangeBalancedIndices)) || (splitIndex >=(endIndex-1-rangeBalancedIndices)));
	
	if (unbalanced)
	{
		splitIndex = startIndex+ (numIndices>>1);
	}

	bool unbal = (splitIndex==startIndex) || (splitIndex == (endIndex));
	(void)unbal;
	btAssert(!unbal);

	return splitIndex;
}